

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_phmap::priv::hash_internal::Enum_&>::Matcher
          (Matcher<const_phmap::priv::hash_internal::Enum_&> *this,Enum *value)

{
  ComparisonBase<testing::internal::EqMatcher<phmap::priv::hash_internal::Enum>,_phmap::priv::hash_internal::Enum,_std::equal_to<void>_>
  local_34;
  Matcher<const_phmap::priv::hash_internal::Enum_&> local_30;
  Enum *local_18;
  Enum *value_local;
  Matcher<const_phmap::priv::hash_internal::Enum_&> *this_local;
  
  local_18 = value;
  value_local = (Enum *)this;
  internal::MatcherBase<const_phmap::priv::hash_internal::Enum_&>::MatcherBase
            (&this->super_MatcherBase<const_phmap::priv::hash_internal::Enum_&>);
  (this->super_MatcherBase<const_phmap::priv::hash_internal::Enum_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_0032ef68;
  local_34.rhs_ = (Enum)Eq<phmap::priv::hash_internal::Enum>(*local_18);
  Matcher<phmap::priv::hash_internal::Enum_const&>::
  Matcher<testing::internal::EqMatcher<phmap::priv::hash_internal::Enum>,void>
            ((Matcher<phmap::priv::hash_internal::Enum_const&> *)&local_30,
             (EqMatcher<phmap::priv::hash_internal::Enum> *)&local_34);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}